

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O2

void __thiscall
ParticleFilter::updateWeights
          (ParticleFilter *this,double sensor_range,double *std_landmark,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations,Map *map_landmarks)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pPVar3;
  pointer pLVar4;
  pointer psVar5;
  undefined1 auVar6 [16];
  pointer psVar7;
  pointer psVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  double dVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar18;
  undefined8 in_XMM2_Qb;
  double dVar19;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> meas_map;
  LandmarkObs cur_meas_map;
  
  for (uVar9 = 0; uVar9 < this->num_particles; uVar9 = uVar9 + 1) {
    pPVar3 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar19 = cos(pPVar3[uVar9].theta);
    dVar17 = sin(pPVar3[uVar9].theta);
    dVar14 = pPVar3[uVar9].x;
    dVar18 = pPVar3[uVar9].y;
    meas_map.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    meas_map.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    meas_map.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar12 = 0;
    while( true ) {
      uVar13 = (ulong)uVar12;
      pLVar4 = (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl
               .super__Vector_impl_data._M_start;
      if ((ulong)(((long)(observations->
                         super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pLVar4) / 0x18) <= uVar13) break;
      in_XMM2_Qb = 0;
      cur_meas_map.x = (pLVar4[uVar13].x * dVar19 + dVar14) - pLVar4[uVar13].y * dVar17;
      cur_meas_map.y = pLVar4[uVar13].y * dVar19 + pLVar4[uVar13].x * dVar17 + dVar18;
      std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::push_back(&meas_map,&cur_meas_map);
      uVar12 = uVar12 + 1;
    }
    pPVar3[uVar9].weight = 1.0;
    dVar14 = 1.0;
    for (uVar12 = 0; uVar13 = (ulong)uVar12,
        uVar13 < (ulong)(((long)meas_map.
                                super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)meas_map.
                               super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl
                               .super__Vector_impl_data._M_start) / 0x18); uVar12 = uVar12 + 1) {
      psVar5 = (map_landmarks->landmark_list).
               super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>.
               _M_impl.super__Vector_impl_data._M_start;
      psVar8 = (pointer)0x0;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = sensor_range * sensor_range;
      for (uVar10 = 0; uVar11 = (ulong)uVar10,
          uVar11 < (ulong)(((long)(map_landmarks->landmark_list).
                                  super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5) / 0xc);
          uVar10 = uVar10 + 1) {
        dVar18 = (double)psVar5[uVar11].x_f -
                 meas_map.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13].x;
        dVar19 = (double)psVar5[uVar11].y_f -
                 meas_map.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13].y;
        dVar18 = dVar18 * dVar18 + dVar19 * dVar19;
        psVar7 = psVar5 + uVar11;
        if (auVar16._0_8_ <= dVar18) {
          dVar18 = auVar16._0_8_;
          psVar7 = psVar8;
        }
        psVar8 = psVar7;
        auVar16._8_8_ = in_XMM2_Qb;
        auVar16._0_8_ = dVar18;
      }
      if (psVar8 != (pointer)0x0) {
        uVar1 = psVar8->x_f;
        uVar2 = psVar8->y_f;
        dVar14 = meas_map.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13].x - (double)(float)uVar1;
        dVar17 = meas_map.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13].y - (double)(float)uVar2;
        dVar18 = *std_landmark;
        dVar19 = std_landmark[1];
        in_XMM2_Qb = 0;
        auVar15._0_8_ = dVar14 * dVar14;
        auVar15._8_8_ = dVar17 * dVar17;
        dVar14 = dVar19 * dVar19 + dVar19 * dVar19;
        auVar6._8_4_ = SUB84(dVar14,0);
        auVar6._0_8_ = dVar18 * dVar18 + dVar18 * dVar18;
        auVar6._12_4_ = (int)((ulong)dVar14 >> 0x20);
        auVar16 = divpd(auVar15,auVar6);
        dVar14 = exp(-(auVar16._8_8_ + auVar16._0_8_));
        dVar14 = dVar14 * (1.0 / (dVar19 * dVar18 * 6.283185307179586)) * pPVar3[uVar9].weight;
        pPVar3[uVar9].weight = dVar14;
      }
    }
    (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar9] = dVar14;
    std::_Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>::~_Vector_base
              (&meas_map.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>);
  }
  return;
}

Assistant:

void ParticleFilter::updateWeights(const double sensor_range, const double std_landmark[], 
		const std::vector<LandmarkObs>& observations, const Map& map_landmarks) 
{
	// TODO: Update the weights of each particle using a mult-variate Gaussian distribution. You can read
	//   more about this distribution here: https://en.wikipedia.org/wiki/Multivariate_normal_distribution
	// NOTE: The observations are given in the VEHICLE'S coordinate system. Your particles are located
	//   according to the MAP'S coordinate system. You will need to transform between the two systems.
	//   Keep in mind that this transformation requires both rotation AND translation (but no scaling).
	//   The following is a good resource for the theory:
	//   https://www.willamette.edu/~gorr/classes/GeneralGraphics/Transforms/transforms2d.htm
	//   and the following is a good resource for the actual equation to implement (look at equation 
	//   3.33. Note that you'll need to switch the minus sign in that equation to a plus to account 
	//   for the fact that the map's y-axis actually points downwards.)
	//   http://planning.cs.uiuc.edu/node99.html
    const double sensor_range_squared = sensor_range*sensor_range;

    for (unsigned int i = 0; i < num_particles; ++i)
    {
        Particle& cur_particle        = particles[i];
        const double cosThetaParticle = std::cos(cur_particle.theta);
        const double sinThetaParticle = std::sin(cur_particle.theta);
        const double xParticle        = cur_particle.x;
        const double yParticle        = cur_particle.y;

        std::vector<LandmarkObs> meas_map;
        for (unsigned int j = 0; j < observations.size(); ++j)
        {
            const LandmarkObs& cur_meas_veh = observations[j];
            LandmarkObs cur_meas_map;

            //Transform from vehicle to map
            cur_meas_map.x = xParticle  + cur_meas_veh.x*cosThetaParticle - cur_meas_veh.y*sinThetaParticle;
            cur_meas_map.y = yParticle  + cur_meas_veh.x*sinThetaParticle + cur_meas_veh.y*cosThetaParticle;
            meas_map.push_back(cur_meas_map);
        }

        cur_particle.weight = 1.0;

        for(unsigned int j = 0; j < meas_map.size(); ++j)
        {
            const LandmarkObs& cur_mea_map = meas_map[j];
            double min_dist_squared = sensor_range_squared;
            const Map::single_landmark_s* closestLm = NULL;

            for (unsigned int k = 0; k < map_landmarks.landmark_list.size(); ++k) 
            {
                const Map::single_landmark_s& cur_lm = map_landmarks.landmark_list[k];
                const double x_lm = cur_lm.x_f;
                const double y_lm = cur_lm.y_f;

                const double cur_dist_squared = distSquared(cur_mea_map.x, cur_mea_map.y, x_lm, y_lm);
                if(cur_dist_squared < min_dist_squared)
                {
                    min_dist_squared = cur_dist_squared;
                    closestLm = &cur_lm;
                }
            }

            if(closestLm)
            {
                const double x_meas   = cur_mea_map.x;
                const double y_meas   = cur_mea_map.y;
                const double x_mu     = closestLm->x_f;
                const double y_mu     = closestLm->y_f;
                const double measProb = 1/(2.0*PI*std_landmark[0]*std_landmark[1])*std::exp(-(std::pow(x_meas-x_mu,2.0)/(2.0*pow(std_landmark[0],2.0))+pow(y_meas-y_mu,2.0)/(2.0*pow(std_landmark[1],2.0))));
                cur_particle.weight   *= measProb;
            }
        }
        weights[i] = cur_particle.weight;
    }
}